

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qfonticonengine.cpp
# Opt level: O0

QString * __thiscall QFontIconEngine::key(QFontIconEngine *this)

{
  long lVar1;
  QStringBuilder<QString,_QString> *in_RSI;
  QStringBuilder<QString,_QString> *in_RDI;
  long in_FS_OFFSET;
  QStringBuilder<QStringBuilder<QString,_QString>,_char16_t> *in_stack_ffffffffffffff08;
  char16_t *in_stack_ffffffffffffff28;
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  Qt::Literals::StringLiterals::operator____s(in_stack_ffffffffffffff28,(size_t)in_RDI);
  QFont::key((QFont *)in_stack_ffffffffffffff08);
  ::operator+(&in_RSI->a,&in_RDI->a);
  ::operator+(in_RSI,(char16_t *)in_RDI);
  ::QStringBuilder::operator_cast_to_QString(in_stack_ffffffffffffff08);
  QStringBuilder<QStringBuilder<QString,_QString>,_char16_t>::~QStringBuilder
            ((QStringBuilder<QStringBuilder<QString,_QString>,_char16_t> *)0x286af8);
  QStringBuilder<QString,_QString>::~QStringBuilder(in_RDI);
  QString::~QString((QString *)0x286b0c);
  QString::~QString((QString *)0x286b16);
  if (*(long *)(in_FS_OFFSET + 0x28) == lVar1) {
    return &in_RDI->a;
  }
  __stack_chk_fail();
}

Assistant:

QString QFontIconEngine::key() const
{
    return u"QFontIconEngine("_s + m_iconFont.key() + u')';
}